

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::predictMotion(btSoftBody *this,btScalar dt)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  Node *pNVar14;
  Face *pFVar15;
  Node *pNVar16;
  Node *pNVar17;
  RContact *pRVar18;
  SContact *pSVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  long lVar23;
  int i;
  long lVar24;
  btVector3 *pbVar25;
  long lVar26;
  float fVar27;
  float extraout_XMM0_Da;
  float fVar28;
  btScalar bVar29;
  btScalar bVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  btVector3 deltaV;
  btDbvtVolume local_c8;
  undefined1 local_a8 [16];
  btVector3 *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  if (this->m_bUpdateRtCst == true) {
    this->m_bUpdateRtCst = false;
    updateConstants(this);
    btDbvt::clear(&this->m_fdbvt);
    if (((this->m_cfg).collisions & 0x10) != 0) {
      initializeFaceTree(this);
    }
  }
  fVar27 = dt * (this->m_cfg).timescale;
  (this->m_sst).sdt = fVar27;
  (this->m_sst).isdt = 1.0 / fVar27;
  (this->m_sst).velmrg = fVar27 * 3.0;
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  (this->m_sst).radmrg = extraout_XMM0_Da;
  (this->m_sst).updmrg = extraout_XMM0_Da * 0.25;
  fVar27 = (this->m_sst).sdt;
  uVar10 = *(undefined8 *)(this->m_worldInfo->m_gravity).m_floats;
  local_a8._4_4_ = fVar27 * (float)((ulong)uVar10 >> 0x20);
  local_a8._0_4_ = fVar27 * (float)uVar10;
  local_a8._8_4_ = fVar27 * (this->m_worldInfo->m_gravity).m_floats[2];
  local_a8._12_4_ = 0.0;
  addVelocity(this,(btVector3 *)local_a8);
  applyForces(this);
  lVar23 = (long)(this->m_nodes).m_size;
  if (0 < lVar23) {
    lVar24 = 0;
    do {
      pNVar14 = (this->m_nodes).m_data;
      pbVar25 = &pNVar14[lVar24].m_f;
      uVar10 = *(undefined8 *)(pNVar14[lVar24].m_x.m_floats + 2);
      *(undefined8 *)pNVar14[lVar24].m_q.m_floats = *(undefined8 *)pNVar14[lVar24].m_x.m_floats;
      *(undefined8 *)(pNVar14[lVar24].m_q.m_floats + 2) = uVar10;
      fVar27 = pNVar14[lVar24].m_im;
      fVar28 = (this->m_sst).sdt;
      local_a8._0_4_ = fVar28 * fVar27 * pbVar25->m_floats[0];
      local_a8._4_4_ = fVar28 * pNVar14[lVar24].m_f.m_floats[1] * fVar27;
      local_a8._8_4_ = pNVar14[lVar24].m_f.m_floats[2] * fVar27 * fVar28;
      local_a8._12_4_ = 0.0;
      fVar28 = this->m_worldInfo->m_maxDisplacement / fVar28;
      fVar27 = -fVar28;
      lVar26 = 0;
      do {
        fVar31 = *(float *)(local_a8 + lVar26 * 4);
        fVar32 = fVar28;
        if ((fVar28 < fVar31) || (fVar32 = fVar31, fVar31 < fVar27)) {
          fVar31 = fVar27;
          if (fVar27 <= fVar32) {
            fVar31 = fVar32;
          }
          *(float *)(local_a8 + lVar26 * 4) = fVar31;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      fVar28 = (float)local_a8._8_4_ + pNVar14[lVar24].m_v.m_floats[2];
      pNVar14[lVar24].m_v.m_floats[2] = fVar28;
      uVar10 = *(undefined8 *)pNVar14[lVar24].m_x.m_floats;
      uVar11 = *(undefined8 *)pNVar14[lVar24].m_v.m_floats;
      fVar31 = (float)uVar11 + local_a8._0_4_;
      fVar32 = (float)((ulong)uVar11 >> 0x20) + local_a8._4_4_;
      *(ulong *)pNVar14[lVar24].m_v.m_floats = CONCAT44(fVar32,fVar31);
      fVar27 = (this->m_sst).sdt;
      *(ulong *)pNVar14[lVar24].m_x.m_floats =
           CONCAT44(fVar27 * fVar32 + (float)((ulong)uVar10 >> 0x20),fVar27 * fVar31 + (float)uVar10
                   );
      pNVar14[lVar24].m_x.m_floats[2] = fVar28 * fVar27 + pNVar14[lVar24].m_x.m_floats[2];
      pbVar25->m_floats[0] = 0.0;
      pbVar25->m_floats[1] = 0.0;
      pNVar14[lVar24].m_f.m_floats[2] = 0.0;
      pNVar14[lVar24].m_f.m_floats[3] = 0.0;
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar23);
  }
  updateClusters(this);
  updateBounds(this);
  lVar23 = (long)(this->m_nodes).m_size;
  if (0 < lVar23) {
    lVar24 = 0;
    do {
      pNVar14 = (this->m_nodes).m_data;
      fVar27 = (this->m_sst).radmrg;
      fVar28 = *(float *)((long)(pNVar14->m_x).m_floats + lVar24 + 8);
      uVar10 = *(undefined8 *)((long)(pNVar14->m_x).m_floats + lVar24);
      fVar31 = (float)uVar10;
      fVar32 = (float)((ulong)uVar10 >> 0x20);
      local_c8.mi.m_floats[1] = fVar32 - fVar27;
      local_c8.mi.m_floats[0] = fVar31 - fVar27;
      local_c8.mi.m_floats[2] = fVar28 - fVar27;
      local_c8.mi.m_floats[3] = 0.0;
      local_c8.mx.m_floats[1] = fVar27 + fVar32;
      local_c8.mx.m_floats[0] = fVar27 + fVar31;
      local_c8.mx.m_floats[2] = fVar27 + fVar28;
      local_c8.mx.m_floats[3] = 0.0;
      fVar27 = (this->m_sst).velmrg;
      uVar10 = *(undefined8 *)((long)(pNVar14->m_v).m_floats + lVar24);
      local_a8._4_4_ = fVar27 * (float)((ulong)uVar10 >> 0x20);
      local_a8._0_4_ = fVar27 * (float)uVar10;
      local_a8._8_4_ = fVar27 * *(float *)((long)(pNVar14->m_v).m_floats + lVar24 + 8);
      local_a8._12_4_ = 0.0;
      btDbvt::update(&this->m_ndbvt,*(btDbvtNode **)((long)(&pNVar14->m_n + 1) + lVar24 + 8),
                     &local_c8,(btVector3 *)local_a8,(this->m_sst).updmrg);
      lVar24 = lVar24 + 0x78;
    } while (lVar23 * 0x78 - lVar24 != 0);
  }
  if (((this->m_fdbvt).m_root != (btDbvtNode *)0x0) && (0 < (this->m_faces).m_size)) {
    lVar23 = 0;
    do {
      pFVar15 = (this->m_faces).m_data;
      pNVar14 = pFVar15[lVar23].m_n[0];
      pNVar16 = pFVar15[lVar23].m_n[1];
      pNVar17 = pFVar15[lVar23].m_n[2];
      fVar27 = (this->m_sst).radmrg;
      local_a8._8_8_ = &pNVar16->m_x;
      local_98 = &pNVar17->m_x;
      uVar12 = *(ulong *)(pNVar14->m_x).m_floats;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar12;
      bVar29 = (pNVar14->m_q).m_floats[0];
      local_c8.mx.m_floats[3] = (pNVar14->m_q).m_floats[1];
      lVar24 = 1;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar12;
      bVar30 = bVar29;
      local_c8.mi.m_floats[3] = local_c8.mx.m_floats[3];
      do {
        uVar12 = **(ulong **)(local_a8 + lVar24 * 8);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar12;
        uVar13 = (*(ulong **)(local_a8 + lVar24 * 8))[1];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar12;
        auVar34 = minps(auVar33,auVar34);
        auVar36 = maxps(auVar35,auVar36);
        fVar28 = (float)uVar13;
        fVar31 = (float)(uVar13 >> 0x20);
        bVar29 = (btScalar)
                 (~-(uint)(bVar29 < fVar28) & (uint)bVar29 | (uint)fVar28 & -(uint)(bVar29 < fVar28)
                 );
        local_c8.mx.m_floats[3] =
             (btScalar)
             (~-(uint)(local_c8.mx.m_floats[3] < fVar31) & (uint)local_c8.mx.m_floats[3] |
             (uint)fVar31 & -(uint)(local_c8.mx.m_floats[3] < fVar31));
        bVar30 = (btScalar)
                 (~-(uint)(fVar28 < bVar30) & (uint)bVar30 | (uint)fVar28 & -(uint)(fVar28 < bVar30)
                 );
        local_c8.mi.m_floats[3] =
             (btScalar)
             (~-(uint)(fVar31 < local_c8.mi.m_floats[3]) & (uint)local_c8.mi.m_floats[3] |
             (uint)fVar31 & -(uint)(fVar31 < local_c8.mi.m_floats[3]));
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      local_c8.mi.m_floats[1] = auVar34._4_4_ - fVar27;
      local_c8.mi.m_floats[0] = auVar34._0_4_ - fVar27;
      local_c8.mi.m_floats[2] = bVar30 - fVar27;
      local_c8.mx.m_floats[1] = fVar27 + auVar36._4_4_;
      local_c8.mx.m_floats[0] = fVar27 + auVar36._0_4_;
      local_c8.mx.m_floats[2] = fVar27 + bVar29;
      fVar27 = (this->m_sst).velmrg;
      local_a8._4_4_ =
           fVar27 * ((pNVar14->m_v).m_floats[1] + (pNVar16->m_v).m_floats[1] +
                    (pNVar17->m_v).m_floats[1]) * 0.33333334;
      local_a8._0_4_ =
           fVar27 * ((pNVar14->m_v).m_floats[0] + (pNVar16->m_v).m_floats[0] +
                    (pNVar17->m_v).m_floats[0]) * 0.33333334;
      local_a8._8_4_ =
           ((pNVar14->m_v).m_floats[2] + (pNVar16->m_v).m_floats[2] + (pNVar17->m_v).m_floats[2]) *
           0.33333334 * fVar27;
      local_a8._12_4_ = 0.0;
      btDbvt::update(&this->m_fdbvt,pFVar15[lVar23].m_leaf,&local_c8,(btVector3 *)local_a8,
                     (this->m_sst).updmrg);
      lVar23 = lVar23 + 1;
    } while (lVar23 < (this->m_faces).m_size);
  }
  updatePose(this);
  if ((((this->m_pose).m_bframe == true) && (0.0 < (this->m_cfg).kMT)) &&
     (lVar23 = (long)(this->m_nodes).m_size, 0 < lVar23)) {
    fVar27 = (this->m_pose).m_rot.m_el[2].m_floats[0];
    fVar28 = (this->m_pose).m_rot.m_el[2].m_floats[1];
    fVar31 = (this->m_pose).m_rot.m_el[2].m_floats[2];
    fVar20 = (this->m_pose).m_rot.m_el[0].m_floats[0];
    fVar21 = (this->m_pose).m_rot.m_el[0].m_floats[1];
    fVar22 = (this->m_pose).m_rot.m_el[0].m_floats[2];
    fVar32 = (this->m_pose).m_rot.m_el[1].m_floats[2];
    fVar2 = (this->m_pose).m_rot.m_el[1].m_floats[0];
    fVar3 = (this->m_pose).m_rot.m_el[1].m_floats[1];
    lVar24 = 0x10;
    lVar26 = 0;
    do {
      pNVar14 = (this->m_nodes).m_data;
      if (0.0 < *(float *)((long)(pNVar14->m_n).m_floats + lVar24)) {
        pbVar25 = (this->m_pose).m_pos.m_data;
        fVar4 = *(float *)((long)pbVar25->m_floats + lVar26);
        fVar5 = *(float *)((long)pbVar25->m_floats + lVar26 + 4);
        fVar6 = *(float *)((long)pbVar25->m_floats + lVar26 + 8);
        fVar7 = (this->m_pose).m_com.m_floats[2];
        fVar8 = (this->m_cfg).kMT;
        fVar9 = *(float *)((long)(pNVar14->m_x).m_floats + lVar24 + -8);
        uVar10 = *(undefined8 *)(this->m_pose).m_com.m_floats;
        uVar11 = *(undefined8 *)
                  ((long)&(((Node *)(&pNVar14->m_x + -1))->super_Feature).super_Element.m_tag +
                  lVar24);
        fVar37 = (float)uVar11;
        fVar38 = (float)((ulong)uVar11 >> 0x20);
        *(ulong *)((long)&(((Node *)(&pNVar14->m_x + -1))->super_Feature).super_Element.m_tag +
                  lVar24) =
             CONCAT44(fVar8 * (((float)((ulong)uVar10 >> 0x20) +
                               fVar6 * fVar32 + fVar4 * fVar2 + fVar5 * fVar3) - fVar38) + fVar38,
                      fVar8 * (((float)uVar10 + fVar6 * fVar22 + fVar4 * fVar20 + fVar5 * fVar21) -
                              fVar37) + fVar37);
        *(ulong *)((long)(pNVar14->m_x).m_floats + lVar24 + -8) =
             (ulong)(uint)(((fVar31 * fVar6 + fVar27 * fVar4 + fVar28 * fVar5 + fVar7) - fVar9) *
                           fVar8 + fVar9);
      }
      lVar26 = lVar26 + 0x10;
      lVar24 = lVar24 + 0x78;
    } while (lVar23 * 0x10 != lVar26);
  }
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = (btVector3 *)0x0;
  uStack_90 = 0;
  local_a8 = ZEXT816(0);
  local_38 = 0;
  uStack_34 = 0;
  lVar23 = (long)(this->m_rcontacts).m_size;
  if (lVar23 < 0) {
    if ((this->m_rcontacts).m_capacity < 0) {
      pRVar18 = (this->m_rcontacts).m_data;
      if ((pRVar18 != (RContact *)0x0) && ((this->m_rcontacts).m_ownsMemory == true)) {
        btAlignedFreeInternal(pRVar18);
      }
      (this->m_rcontacts).m_ownsMemory = true;
      (this->m_rcontacts).m_data = (RContact *)0x0;
      (this->m_rcontacts).m_capacity = 0;
    }
    lVar24 = lVar23 * 0x78 + 0x58;
    do {
      pRVar18 = (this->m_rcontacts).m_data;
      puVar1 = (undefined8 *)((long)(&(pRVar18->m_cti).m_normal + -5) + lVar24);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(&(pRVar18->m_cti).m_normal + -6) + lVar24);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(&(pRVar18->m_cti).m_normal + -4) + lVar24) = 0;
      puVar1 = (undefined8 *)((long)(pRVar18->m_cti).m_normal.m_floats + lVar24 + -0x38);
      *puVar1 = uStack_80;
      puVar1[1] = local_78;
      puVar1 = (undefined8 *)((long)(&pRVar18->m_cti + -1) + lVar24);
      *puVar1 = uStack_70;
      puVar1[1] = local_68;
      puVar1 = (undefined8 *)((long)(pRVar18->m_cti).m_normal.m_floats + lVar24 + -0x18);
      *puVar1 = uStack_60;
      puVar1[1] = local_58;
      puVar1 = (undefined8 *)((long)(pRVar18->m_cti).m_normal.m_floats + lVar24 + 4);
      *puVar1 = CONCAT44(uStack_40,uStack_44);
      puVar1[1] = CONCAT44(local_38,uStack_3c);
      puVar1 = (undefined8 *)((long)(pRVar18->m_cti).m_normal.m_floats + lVar24 + -8);
      *puVar1 = uStack_50;
      puVar1[1] = CONCAT44(uStack_44,local_48);
      lVar24 = lVar24 + 0x78;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0);
  }
  (this->m_rcontacts).m_size = 0;
  lVar23 = (long)(this->m_scontacts).m_size;
  if (lVar23 < 0) {
    if ((this->m_scontacts).m_capacity < 0) {
      pSVar19 = (this->m_scontacts).m_data;
      if ((pSVar19 != (SContact *)0x0) && ((this->m_scontacts).m_ownsMemory == true)) {
        btAlignedFreeInternal(pSVar19);
      }
      (this->m_scontacts).m_ownsMemory = true;
      (this->m_scontacts).m_data = (SContact *)0x0;
      (this->m_scontacts).m_capacity = 0;
    }
    lVar24 = lVar23 << 6;
    do {
      pSVar19 = (this->m_scontacts).m_data;
      puVar1 = (undefined8 *)((long)pSVar19->m_cfm + lVar24 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pSVar19->m_normal).m_floats + lVar24);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pSVar19->m_weights).m_floats + lVar24);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&((SContact *)(&pSVar19->m_weights + -1))->m_node + lVar24);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar24 = lVar24 + 0x40;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0);
  }
  (this->m_scontacts).m_size = 0;
  btDbvt::optimizeIncremental(&this->m_ndbvt,1);
  btDbvt::optimizeIncremental(&this->m_fdbvt,1);
  btDbvt::optimizeIncremental(&this->m_cdbvt,1);
  return;
}

Assistant:

void			btSoftBody::predictMotion(btScalar dt)
{

	int i,ni;

	/* Update				*/ 
	if(m_bUpdateRtCst)
	{
		m_bUpdateRtCst=false;
		updateConstants();
		m_fdbvt.clear();
		if(m_cfg.collisions&fCollision::VF_SS)
		{
			initializeFaceTree();			
		}
	}

	/* Prepare				*/ 
	m_sst.sdt		=	dt*m_cfg.timescale;
	m_sst.isdt		=	1/m_sst.sdt;
	m_sst.velmrg	=	m_sst.sdt*3;
	m_sst.radmrg	=	getCollisionShape()->getMargin();
	m_sst.updmrg	=	m_sst.radmrg*(btScalar)0.25;
	/* Forces				*/ 
	addVelocity(m_worldInfo->m_gravity*m_sst.sdt);
	applyForces();
	/* Integrate			*/ 
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_q	=	n.m_x;
		btVector3 deltaV = n.m_f*n.m_im*m_sst.sdt;
		{
			btScalar maxDisplacement = m_worldInfo->m_maxDisplacement;
			btScalar clampDeltaV = maxDisplacement/m_sst.sdt;
			for (int c=0;c<3;c++)
			{
				if (deltaV[c]>clampDeltaV)
				{
					deltaV[c] = clampDeltaV;
				}
				if (deltaV[c]<-clampDeltaV)
				{
					deltaV[c]=-clampDeltaV;
				}
			}
		}
		n.m_v	+=	deltaV;
		n.m_x	+=	n.m_v*m_sst.sdt;
		n.m_f	=	btVector3(0,0,0);
	}
	/* Clusters				*/ 
	updateClusters();
	/* Bounds				*/ 
	updateBounds();	
	/* Nodes				*/ 
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		vol = btDbvtVolume::FromCR(n.m_x,m_sst.radmrg);
		m_ndbvt.update(	n.m_leaf,
			vol,
			n.m_v*m_sst.velmrg,
			m_sst.updmrg);
	}
	/* Faces				*/ 
	if(!m_fdbvt.empty())
	{
		for(int i=0;i<m_faces.size();++i)
		{
			Face&			f=m_faces[i];
			const btVector3	v=(	f.m_n[0]->m_v+
				f.m_n[1]->m_v+
				f.m_n[2]->m_v)/3;
			vol = VolumeOf(f,m_sst.radmrg);
			m_fdbvt.update(	f.m_leaf,
				vol,
				v*m_sst.velmrg,
				m_sst.updmrg);
		}
	}
	/* Pose					*/ 
	updatePose();
	/* Match				*/ 
	if(m_pose.m_bframe&&(m_cfg.kMT>0))
	{
		const btMatrix3x3	posetrs=m_pose.m_rot;
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			if(n.m_im>0)
			{
				const btVector3	x=posetrs*m_pose.m_pos[i]+m_pose.m_com;
				n.m_x=Lerp(n.m_x,x,m_cfg.kMT);
			}
		}
	}
	/* Clear contacts		*/ 
	m_rcontacts.resize(0);
	m_scontacts.resize(0);
	/* Optimize dbvt's		*/ 
	m_ndbvt.optimizeIncremental(1);
	m_fdbvt.optimizeIncremental(1);
	m_cdbvt.optimizeIncremental(1);
}